

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O3

int Abc_FlowRetime_VerifyPathLatencies_rec(Abc_Obj_t *pObj,int markD)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  char *__s;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  uVar4 = *(uint *)&pObj->field_0x14;
  uVar6 = 0xffffffff;
  if ((uVar4 & 0x20) == 0) {
    *(uint *)&pObj->field_0x14 = uVar4 | 0x20;
    uVar5 = 1;
    if ((uVar4 & 0xf) != 8) {
      uVar5 = uVar4 >> 6 & 1;
    }
    iVar1 = (pObj->vFanouts).nSize;
    if (((pManMR->fIsForward != 0 || iVar1 != 0) || (uVar4 & 0xf) == 3) && (0 < iVar1)) {
      lVar7 = 0;
      bVar2 = false;
      do {
        pObj_00 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar7]];
        uVar4 = *(uint *)&pObj_00->field_0x14 & 0xf;
        if (uVar4 == 5) {
LAB_004d7cc0:
          if ((markD == 0) && ((*(uint *)&pObj->field_0x14 & 0xf) != 8)) {
            __s = "\nERROR: no-latch path (end)";
LAB_004d7ddd:
            puts(__s);
            print_node(pObj_00);
            putchar(10);
            fPathError = 1;
            goto LAB_004d7dfe;
          }
        }
        else {
          if (pManMR->fIsForward == 0) {
            if (uVar4 == 3) {
              if ((markD != 0) || ((*(uint *)&pObj->field_0x14 & 0xf) == 8)) {
                __s = "\nERROR: extra-latch path to outputs";
                goto LAB_004d7ddd;
              }
              goto LAB_004d7d2a;
            }
          }
          else if (uVar4 == 3) goto LAB_004d7cc0;
          uVar4 = 1;
          if (markD == 0) {
            uVar4 = (uint)((*(uint *)&pObj->field_0x14 & 0xf) == 8);
          }
          uVar4 = Abc_FlowRetime_VerifyPathLatencies_rec(pObj_00,uVar4);
          bVar3 = true;
          if ((int)uVar4 < 0) {
            uVar4 = 0;
            bVar3 = bVar2;
          }
          bVar2 = bVar3;
          uVar5 = uVar5 | uVar4;
        }
LAB_004d7d2a:
        if (fPathError != 0) {
LAB_004d7dfe:
          print_node(pObj);
          putchar(10);
          return 0;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < (pObj->vFanouts).nSize);
      uVar6 = 0xffffffff;
      if (bVar2) {
        if ((markD != 0) && (uVar5 != 0)) {
          puts("\nERROR: mult-latch path");
          print_node(pObj);
          putchar(10);
          fPathError = 1;
        }
        if (markD == 0 && uVar5 == 0) {
          puts("\nERROR: no-latch path (inter)");
          print_node(pObj);
          putchar(10);
          fPathError = 1;
        }
        uVar6 = uVar5 & 1;
        *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffbf | uVar6 << 6;
      }
    }
  }
  return uVar6;
}

Assistant:

int
Abc_FlowRetime_VerifyPathLatencies_rec( Abc_Obj_t * pObj, int markD ) {
  int i, j;
  Abc_Obj_t *pNext;
  int fCare = 0;
  int markC = pObj->fMarkC;

  if (!pObj->fMarkB) {
    pObj->fMarkB = 1; // visited
    
    if (Abc_ObjIsLatch(pObj))
      markC = 1;      // latch in output
    
    if (!pManMR->fIsForward && !Abc_ObjIsPo(pObj) && !Abc_ObjFanoutNum(pObj))
      return -1; // dangling non-PO outputs : don't care what happens
    
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      // reached end of cycle?
      if ( Abc_ObjIsBo(pNext) ||
           (pManMR->fIsForward && Abc_ObjIsPo(pNext)) ) {
        if (!markD && !Abc_ObjIsLatch(pObj)) {
          printf("\nERROR: no-latch path (end)\n");
          print_node(pNext);
          printf("\n");
          fPathError = 1;
        }
      } else if (!pManMR->fIsForward && Abc_ObjIsPo(pNext)) {
        if (markD || Abc_ObjIsLatch(pObj)) {
          printf("\nERROR: extra-latch path to outputs\n");
          print_node(pNext);
          printf("\n");
          fPathError = 1;
        }
      } else {
        j = Abc_FlowRetime_VerifyPathLatencies_rec( pNext, markD || Abc_ObjIsLatch(pObj) );
        if (j >= 0) {
          markC |= j;
          fCare = 1;
        }
      }

      if (fPathError) {
        print_node(pObj);
        printf("\n");
        return 0;
      }
    }
  }

  if (!fCare) return -1;

  if (markC && markD) {
    printf("\nERROR: mult-latch path\n");
    print_node(pObj);
    printf("\n");
    fPathError = 1;
  }
  if (!markC && !markD) {
    printf("\nERROR: no-latch path (inter)\n");
    print_node(pObj);
    printf("\n");
    fPathError = 1;
  }

  return (pObj->fMarkC = markC);
}